

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

int s2pred::TriageCompareEdgeDistance<double>
              (Vector3<double> *x,Vector3<double> *a0,Vector3<double> *a1,double r2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double __x;
  double n1;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Vector3<double> n;
  Vector3<double> local_68;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  dVar13 = a0->c_[0];
  dVar12 = a0->c_[1];
  dVar11 = a0->c_[2];
  dVar10 = a1->c_[0];
  dVar9 = a1->c_[1];
  dVar8 = a1->c_[2];
  local_68.c_[0] = (dVar12 - dVar9) * (dVar11 + dVar8) - (dVar12 + dVar9) * (dVar11 - dVar8);
  local_68.c_[1] = (dVar11 - dVar8) * (dVar13 + dVar10) - (dVar11 + dVar8) * (dVar13 - dVar10);
  local_68.c_[2] = (dVar12 + dVar9) * (dVar13 - dVar10) - (dVar13 + dVar10) * (dVar12 - dVar9);
  dVar5 = x->c_[2];
  dVar15 = x->c_[0];
  dVar14 = x->c_[1];
  local_28 = local_68.c_[1] * dVar5 - local_68.c_[2] * dVar14;
  local_30 = local_68.c_[2] * dVar15 - local_68.c_[0] * dVar5;
  dVar6 = local_68.c_[0] * dVar14 - local_68.c_[1] * dVar15;
  dVar13 = dVar13 - dVar15;
  dVar12 = dVar12 - dVar14;
  dVar11 = dVar11 - dVar5;
  dVar7 = dVar13 * local_28;
  __x = local_68.c_[2] * local_68.c_[2] +
        local_68.c_[1] * local_68.c_[1] + local_68.c_[0] * local_68.c_[0];
  if (__x < 0.0) {
    local_50 = dVar12 * local_30;
    local_48 = dVar15;
    local_40 = dVar14;
    local_38 = dVar5;
    n1 = sqrt(__x);
    dVar4 = local_50;
    dVar5 = local_38;
    dVar14 = local_40;
    dVar15 = local_48;
  }
  else {
    n1 = SQRT(__x);
    dVar4 = dVar12 * local_30;
  }
  dVar10 = dVar10 - dVar15;
  dVar9 = dVar9 - dVar14;
  dVar8 = dVar8 - dVar5;
  dVar5 = (n1 * 8.118802153517006 + 6.153480596427404e-15) * 1.1102230246251565e-16;
  dVar13 = dVar11 * dVar11 + dVar12 * dVar12 + dVar13 * dVar13;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar11 = dVar11 * dVar6 + dVar7 + 0.0 + dVar4;
  dVar12 = dVar8 * dVar8 + dVar9 * dVar9 + dVar10 * dVar10;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  if ((ABS(dVar11) < dVar13 * dVar5) ||
     (dVar13 = dVar8 * dVar6 + dVar9 * local_30 + dVar10 * local_28 + 0.0,
     ABS(dVar13) < dVar12 * dVar5)) {
    iVar1 = TriageCompareDistance<double>(x,a0,r2);
    iVar2 = TriageCompareDistance<double>(x,a1,r2);
    if (iVar2 < iVar1) {
      iVar1 = iVar2;
    }
    if (k45Degrees <= r2) {
      iVar2 = TriageCompareLineCos2Distance<double>(x,a0,a1,r2,&local_68,n1,__x);
    }
    else {
      iVar2 = TriageCompareLineSin2Distance<double>(x,a0,a1,r2,&local_68,n1,__x);
    }
    iVar3 = 0;
    if (iVar1 == iVar2) {
      iVar3 = iVar2;
    }
  }
  else if ((0.0 <= dVar11) || (dVar13 <= 0.0)) {
    iVar1 = TriageCompareDistance<double>(x,a0,r2);
    iVar3 = TriageCompareDistance<double>(x,a1,r2);
    if (iVar1 <= iVar3) {
      iVar3 = iVar1;
    }
  }
  else if (k45Degrees <= r2) {
    iVar3 = TriageCompareLineCos2Distance<double>(x,a0,a1,r2,&local_68,n1,__x);
  }
  else {
    iVar3 = TriageCompareLineSin2Distance<double>(x,a0,a1,r2,&local_68,n1,__x);
  }
  return iVar3;
}

Assistant:

int TriageCompareEdgeDistance(const Vector3<T>& x, const Vector3<T>& a0,
                              const Vector3<T>& a1, T r2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // First we need to decide whether the closest point is an edge endpoint or
  // somewhere in the interior.  To determine this we compute a plane
  // perpendicular to (a0, a1) that passes through X.  Letting M be the normal
  // to this plane, the closest point is in the edge interior if and only if
  // a0.M < 0 and a1.M > 0.  Note that we can use "<" rather than "<=" because
  // if a0.M or a1.M is zero exactly then it doesn't matter which code path we
  // follow (since the distance to an endpoint and the distance to the edge
  // interior are exactly the same in this case).
  Vector3<T> n = (a0 - a1).CrossProd(a0 + a1);
  Vector3<T> m = n.CrossProd(x);
  // For better accuracy when the edge (a0,a1) is very short, we subtract "x"
  // before computing the dot products with M.
  Vector3<T> a0_dir = a0 - x;
  Vector3<T> a1_dir = a1 - x;
  T a0_sign = a0_dir.DotProd(m);
  T a1_sign = a1_dir.DotProd(m);
  T n2 = n.Norm2();
  T n1 = sqrt(n2);
  T n1_error = ((3.5 + 8 / sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) * T_ERR;
  T a0_sign_error = n1_error * a0_dir.Norm();
  T a1_sign_error = n1_error * a1_dir.Norm();
  if (fabs(a0_sign) < a0_sign_error || fabs(a1_sign) < a1_sign_error) {
    // It is uncertain whether minimum distance is to an edge vertex or to the
    // edge interior.  We handle this by computing both distances and checking
    // whether they yield the same result.
    int vertex_sign = min(TriageCompareDistance(x, a0, r2),
                          TriageCompareDistance(x, a1, r2));
    int line_sign = TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
    return (vertex_sign == line_sign) ? line_sign : 0;
  }
  if (a0_sign >= 0 || a1_sign <= 0) {
    // The minimum distance is to an edge endpoint.
    return min(TriageCompareDistance(x, a0, r2),
               TriageCompareDistance(x, a1, r2));
  } else {
    // The minimum distance is to the edge interior.
    return TriageCompareLineDistance(x, a0, a1, r2, n, n1, n2);
  }
}